

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::Cues::AddCue(Cues *this,CuePoint *cue)

{
  int iVar1;
  CuePoint **ppCVar2;
  CuePoint **ppCVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  if (cue == (CuePoint *)0x0) {
    return false;
  }
  iVar1 = this->cue_entries_capacity_;
  uVar7 = this->cue_entries_size_;
  if ((int)uVar7 < iVar1) {
    ppCVar3 = this->cue_entries_;
  }
  else {
    uVar6 = 2;
    if (iVar1 != 0) {
      uVar6 = iVar1 * 2;
    }
    if ((int)uVar6 < 1) {
      uVar4 = 0;
      goto LAB_00147884;
    }
    ppCVar3 = (CuePoint **)operator_new__((ulong)uVar6 << 3,(nothrow_t *)&std::nothrow);
    uVar4 = 0;
    if (ppCVar3 == (CuePoint **)0x0) goto LAB_00147884;
    ppCVar2 = this->cue_entries_;
    uVar5 = 0;
    if (0 < (int)uVar7) {
      uVar5 = (ulong)uVar7;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      ppCVar3[uVar4] = ppCVar2[uVar4];
    }
    if (ppCVar2 != (CuePoint **)0x0) {
      operator_delete__(ppCVar2);
      uVar7 = this->cue_entries_size_;
    }
    this->cue_entries_ = ppCVar3;
    this->cue_entries_capacity_ = uVar6;
  }
  cue->output_block_number_ = this->output_block_number_;
  this->cue_entries_size_ = uVar7 + 1;
  ppCVar3[(int)uVar7] = cue;
  uVar4 = 1;
LAB_00147884:
  return SUB81(uVar4,0);
}

Assistant:

bool Cues::AddCue(CuePoint* cue) {
  if (!cue)
    return false;

  if ((cue_entries_size_ + 1) > cue_entries_capacity_) {
    // Add more CuePoints.
    const int32_t new_capacity =
        (!cue_entries_capacity_) ? 2 : cue_entries_capacity_ * 2;

    if (new_capacity < 1)
      return false;

    CuePoint** const cues =
        new (std::nothrow) CuePoint*[new_capacity];  // NOLINT
    if (!cues)
      return false;

    for (int32_t i = 0; i < cue_entries_size_; ++i) {
      cues[i] = cue_entries_[i];
    }

    delete[] cue_entries_;

    cue_entries_ = cues;
    cue_entries_capacity_ = new_capacity;
  }

  cue->set_output_block_number(output_block_number_);
  cue_entries_[cue_entries_size_++] = cue;
  return true;
}